

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  RTCRayQueryContext *pRVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong unaff_R12;
  size_t mask;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined4 uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_2684;
  int local_2664;
  RTCIntersectArguments *local_2660;
  RayHit *local_2658;
  ulong local_2650;
  Geometry *local_2648;
  ulong *local_2640;
  ulong local_2638;
  ulong local_2630;
  ulong local_2628;
  RayQueryContext *local_2620;
  Scene *local_2618;
  ulong local_2610;
  ulong local_2608;
  ulong local_2600;
  RTCFilterFunctionNArguments local_25f8;
  float local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  float local_25bc;
  float local_25b8;
  undefined4 local_25b4;
  uint local_25b0;
  uint local_25ac;
  uint local_25a8;
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  byte local_2558;
  float local_2548 [4];
  float local_2538 [4];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar33 = vpandd_avx512vl((undefined1  [16])aVar3,auVar37);
    auVar34 = vprolq_avx512vl(auVar33,0x20);
    auVar35 = vshufps_avx(auVar33,auVar33,0x4e);
    auVar37 = vmaxss_avx(auVar33,auVar34);
    uVar28 = 2;
    if (auVar35._0_4_ < auVar37._0_4_) {
      uVar28 = (uint)(auVar33._0_4_ <= auVar34._0_4_);
    }
    uVar21 = uVar28 + 1;
    if (uVar28 + 1 == 3) {
      uVar21 = 0;
    }
    uVar29 = uVar21 + 1;
    if (uVar21 + 1 == 3) {
      uVar29 = 0;
    }
    local_2630 = (ulong)uVar28;
    fVar2 = (float)ray->instID[local_2630 - 0xf];
    uVar28 = uVar21;
    if (fVar2 < 0.0) {
      uVar28 = uVar29;
    }
    local_2638 = (ulong)uVar28;
    if (fVar2 < 0.0) {
      uVar29 = uVar21;
    }
    local_2628 = (ulong)uVar29;
    uVar28 = ray->instID[local_2638 - 0x13];
    auVar65 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
    uVar28 = ray->instID[local_2628 - 0x13];
    auVar66 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
    uVar28 = ray->instID[local_2630 - 0x13];
    auVar68 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar35._4_12_ = ZEXT812(0) << 0x20;
      auVar35._0_4_ = fVar2;
      auVar35 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar35);
      auVar37 = vfnmadd213ss_fma(ZEXT416((uint)fVar2),auVar35,ZEXT416(0x40000000));
      fVar2 = auVar35._0_4_ * auVar37._0_4_;
      local_2640 = local_2368;
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar35 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar33,auVar36,1);
      bVar5 = (bool)((byte)uVar25 & 1);
      auVar34._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar3.x;
      bVar5 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar3.y;
      bVar5 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar3.z;
      bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * aVar3.field_3.a;
      auVar36 = vrcp14ps_avx512vl(auVar34);
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = &DAT_3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar33 = vfnmadd213ps_avx512vl(auVar34,auVar36,auVar33);
      auVar36 = vfmadd132ps_fma(auVar33,auVar36,auVar36);
      auVar42 = vbroadcastss_avx512vl(auVar36);
      auVar70 = ZEXT3264(auVar42);
      auVar33 = vmovshdup_avx(auVar36);
      auVar42 = vbroadcastsd_avx512vl(auVar33);
      auVar71 = ZEXT3264(auVar42);
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      auVar42 = vpermps_avx512vl(auVar62,ZEXT1632(auVar36));
      auVar72 = ZEXT3264(auVar42);
      fVar49 = auVar36._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar42 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar73 = ZEXT3264(auVar42);
      auVar47._4_4_ = fVar49;
      auVar47._0_4_ = fVar49;
      auVar47._8_4_ = fVar49;
      auVar47._12_4_ = fVar49;
      auVar47._16_4_ = fVar49;
      auVar47._20_4_ = fVar49;
      auVar47._24_4_ = fVar49;
      auVar47._28_4_ = fVar49;
      auVar44 = ZEXT1632(CONCAT412(auVar36._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar36._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar36._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar49))));
      auVar43 = vpermps_avx512vl(auVar42,auVar44);
      auVar42 = vpermps_avx2(auVar62,auVar44);
      auVar63 = ZEXT3264(auVar42);
      uVar24 = (ulong)(auVar36._0_4_ < 0.0) << 5;
      uVar30 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x40;
      uVar27 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
      local_2600 = uVar30 ^ 0x20;
      uVar60 = auVar35._0_4_;
      auVar53 = ZEXT3264(CONCAT428(uVar60,CONCAT424(uVar60,CONCAT420(uVar60,CONCAT416(uVar60,
                                                  CONCAT412(uVar60,CONCAT48(uVar60,CONCAT44(uVar60,
                                                  uVar60))))))));
      auVar45._8_4_ = 0x80000000;
      auVar45._0_8_ = 0x8000000080000000;
      auVar45._12_4_ = 0x80000000;
      auVar45._16_4_ = 0x80000000;
      auVar45._20_4_ = 0x80000000;
      auVar45._24_4_ = 0x80000000;
      auVar45._28_4_ = 0x80000000;
      auVar44 = vxorps_avx512vl(auVar47,auVar45);
      auVar74 = ZEXT3264(auVar44);
      auVar43 = vxorps_avx512vl(auVar43,auVar45);
      auVar75 = ZEXT3264(auVar43);
      auVar42 = vxorps_avx512vl(auVar42,auVar45);
      auVar76 = ZEXT3264(auVar42);
      auVar42 = vbroadcastss_avx512vl(auVar37);
      auVar77 = ZEXT3264(auVar42);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)((float)ray->instID[local_2638 - 0xf] * fVar2)))
      ;
      auVar78 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)((float)ray->instID[local_2628 - 0xf] * fVar2)))
      ;
      auVar79 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)fVar2));
      auVar80 = ZEXT1664(auVar37);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar81 = ZEXT3264(auVar42);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar82 = ZEXT3264(auVar42);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar83 = ZEXT1664(auVar37);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar84 = ZEXT3264(auVar42);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar85 = ZEXT3264(auVar42);
      local_2608 = uVar24;
      local_2610 = uVar27;
      local_2620 = context;
      uVar25 = uVar24;
      uVar23 = uVar27;
      local_2658 = ray;
      do {
        do {
          do {
            if (local_2640 == &local_2378) {
              return;
            }
            pfVar1 = (float *)(local_2640 + -1);
            local_2640 = local_2640 + -2;
          } while ((local_2658->super_RayK<1>).tfar < *pfVar1);
          uVar32 = *local_2640;
          do {
            if ((uVar32 & 8) == 0) {
              auVar42 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + uVar25),auVar74._0_32_,
                                   auVar70._0_32_);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + uVar30),auVar75._0_32_,
                                   auVar71._0_32_);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + uVar23),auVar76._0_32_,
                                   auVar72._0_32_);
              auVar43 = vpmaxsd_avx512vl(auVar43,auVar77._0_32_);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              auVar63 = ZEXT3264(auVar42);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar24 ^ 0x20)),
                                   auVar74._0_32_,auVar70._0_32_);
              auVar44 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + local_2600),auVar75._0_32_
                                   ,auVar71._0_32_);
              auVar43 = vpminsd_avx2(auVar43,auVar44);
              auVar44 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar27 ^ 0x20)),
                                   auVar76._0_32_,auVar72._0_32_);
              auVar44 = vpminsd_avx2(auVar44,auVar53._0_32_);
              auVar43 = vpminsd_avx2(auVar43,auVar44);
              uVar16 = vpcmpd_avx512vl(auVar42,auVar43,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar16);
            }
            if ((uVar32 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar20 = 4;
              }
              else {
                auVar42 = *(undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0);
                auVar43 = ((undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0))[1];
                auVar44 = vmovdqa64_avx512vl(auVar81._0_32_);
                auVar62 = auVar63._0_32_;
                auVar44 = vpternlogd_avx512vl(auVar44,auVar62,auVar82._0_32_,0xf8);
                uVar32 = unaff_R12 & 0xffffffff;
                auVar45 = vpcompressd_avx512vl(auVar44);
                bVar5 = (bool)((byte)uVar32 & 1);
                auVar46._0_4_ = (uint)bVar5 * auVar45._0_4_ | (uint)!bVar5 * auVar44._0_4_;
                bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar5 * auVar45._4_4_ | (uint)!bVar5 * auVar44._4_4_;
                bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar5 * auVar45._8_4_ | (uint)!bVar5 * auVar44._8_4_;
                bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
                auVar46._12_4_ = (uint)bVar5 * auVar45._12_4_ | (uint)!bVar5 * auVar44._12_4_;
                bVar5 = (bool)((byte)(uVar32 >> 4) & 1);
                auVar46._16_4_ = (uint)bVar5 * auVar45._16_4_ | (uint)!bVar5 * auVar44._16_4_;
                bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
                auVar46._20_4_ = (uint)bVar5 * auVar45._20_4_ | (uint)!bVar5 * auVar44._20_4_;
                bVar5 = (bool)((byte)(uVar32 >> 6) & 1);
                auVar46._24_4_ = (uint)bVar5 * auVar45._24_4_ | (uint)!bVar5 * auVar44._24_4_;
                bVar5 = (bool)((byte)(uVar32 >> 7) & 1);
                auVar46._28_4_ = (uint)bVar5 * auVar45._28_4_ | (uint)!bVar5 * auVar44._28_4_;
                auVar44 = vpermt2q_avx512vl(auVar42,auVar46,auVar43);
                uVar32 = auVar44._0_8_;
                iVar20 = 0;
                uVar22 = unaff_R12 - 1 & unaff_R12;
                if (uVar22 != 0) {
                  auVar44 = vpshufd_avx2(auVar46,0x55);
                  vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                  auVar45 = vpminsd_avx2(auVar46,auVar44);
                  auVar44 = vpmaxsd_avx2(auVar46,auVar44);
                  uVar22 = uVar22 - 1 & uVar22;
                  if (uVar22 == 0) {
                    auVar45 = vpermi2q_avx512vl(auVar45,auVar42,auVar43);
                    uVar32 = auVar45._0_8_;
                    auVar42 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                    *local_2640 = auVar42._0_8_;
                    auVar42 = vpermd_avx2(auVar44,auVar62);
                    *(int *)(local_2640 + 1) = auVar42._0_4_;
                    local_2640 = local_2640 + 2;
                  }
                  else {
                    auVar48 = vpshufd_avx2(auVar46,0xaa);
                    vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                    auVar47 = vpminsd_avx2(auVar45,auVar48);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar48);
                    auVar48 = vpminsd_avx2(auVar44,auVar45);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                    uVar22 = uVar22 - 1 & uVar22;
                    if (uVar22 == 0) {
                      auVar45 = vpermi2q_avx512vl(auVar47,auVar42,auVar43);
                      uVar32 = auVar45._0_8_;
                      auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                      *local_2640 = auVar45._0_8_;
                      auVar44 = vpermd_avx2(auVar44,auVar62);
                      *(int *)(local_2640 + 1) = auVar44._0_4_;
                      auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                      local_2640[2] = auVar42._0_8_;
                      auVar42 = vpermd_avx2(auVar48,auVar62);
                      *(int *)(local_2640 + 3) = auVar42._0_4_;
                      local_2640 = local_2640 + 4;
                    }
                    else {
                      auVar45 = vpshufd_avx2(auVar46,0xff);
                      vpermt2q_avx512vl(auVar42,auVar45,auVar43);
                      auVar10 = vpminsd_avx2(auVar47,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar47,auVar45);
                      auVar47 = vpminsd_avx2(auVar48,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar48,auVar45);
                      auVar48 = vpminsd_avx2(auVar44,auVar45);
                      auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                      uVar22 = uVar22 - 1 & uVar22;
                      if (uVar22 == 0) {
                        auVar45 = vpermi2q_avx512vl(auVar10,auVar42,auVar43);
                        uVar32 = auVar45._0_8_;
                        auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                        *local_2640 = auVar45._0_8_;
                        auVar63 = ZEXT3264(auVar62);
                        auVar44 = vpermd_avx2(auVar44,auVar62);
                        *(int *)(local_2640 + 1) = auVar44._0_4_;
                        auVar44 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                        local_2640[2] = auVar44._0_8_;
                        auVar44 = vpermd_avx2(auVar48,auVar62);
                        *(int *)(local_2640 + 3) = auVar44._0_4_;
                        auVar42 = vpermt2q_avx512vl(auVar42,auVar47,auVar43);
                        local_2640[4] = auVar42._0_8_;
                        auVar42 = vpermd_avx2(auVar47,auVar62);
                        *(int *)(local_2640 + 5) = auVar42._0_4_;
                        local_2640 = local_2640 + 6;
                        auVar69 = ZEXT864(0);
                      }
                      else {
                        auVar46 = valignd_avx512vl(auVar46,auVar46,3);
                        auVar45 = vmovdqa64_avx512vl(auVar83._0_32_);
                        auVar45 = vpermt2d_avx512vl(auVar45,auVar84._0_32_,auVar10);
                        auVar45 = vpermt2d_avx512vl(auVar45,auVar85._0_32_,auVar47);
                        auVar47 = vpermt2d_avx512vl(auVar45,auVar85._0_32_,auVar48);
                        auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar44 = vpermt2d_avx512vl(auVar47,auVar45,auVar44);
                        auVar63 = ZEXT3264(auVar44);
                        uVar32 = uVar22;
                        do {
                          auVar45 = auVar63._0_32_;
                          auVar44 = vpermps_avx512vl(auVar73._0_32_,auVar46);
                          auVar46 = valignd_avx512vl(auVar46,auVar46,1);
                          vpermt2q_avx512vl(auVar42,auVar46,auVar43);
                          uVar32 = uVar32 - 1 & uVar32;
                          uVar16 = vpcmpd_avx512vl(auVar44,auVar45,5);
                          auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                          bVar19 = (byte)uVar16 << 1;
                          auVar45 = valignd_avx512vl(auVar45,auVar45,7);
                          bVar5 = (bool)((byte)uVar16 & 1);
                          auVar48._4_4_ = (uint)bVar5 * auVar45._4_4_ | (uint)!bVar5 * auVar44._4_4_
                          ;
                          auVar48._0_4_ = auVar44._0_4_;
                          bVar5 = (bool)(bVar19 >> 2 & 1);
                          auVar48._8_4_ = (uint)bVar5 * auVar45._8_4_ | (uint)!bVar5 * auVar44._8_4_
                          ;
                          bVar5 = (bool)(bVar19 >> 3 & 1);
                          auVar48._12_4_ =
                               (uint)bVar5 * auVar45._12_4_ | (uint)!bVar5 * auVar44._12_4_;
                          bVar5 = (bool)(bVar19 >> 4 & 1);
                          auVar48._16_4_ =
                               (uint)bVar5 * auVar45._16_4_ | (uint)!bVar5 * auVar44._16_4_;
                          bVar5 = (bool)(bVar19 >> 5 & 1);
                          auVar48._20_4_ =
                               (uint)bVar5 * auVar45._20_4_ | (uint)!bVar5 * auVar44._20_4_;
                          bVar5 = (bool)(bVar19 >> 6 & 1);
                          auVar48._24_4_ =
                               (uint)bVar5 * auVar45._24_4_ | (uint)!bVar5 * auVar44._24_4_;
                          auVar48._28_4_ =
                               (uint)(bVar19 >> 7) * auVar45._28_4_ |
                               (uint)!(bool)(bVar19 >> 7) * auVar44._28_4_;
                          auVar63 = ZEXT3264(auVar48);
                        } while (uVar32 != 0);
                        lVar26 = POPCOUNT(uVar22) + 3;
                        do {
                          auVar44 = vpermi2q_avx512vl(auVar48,auVar42,auVar43);
                          *local_2640 = auVar44._0_8_;
                          auVar45 = auVar63._0_32_;
                          auVar44 = vpermd_avx2(auVar45,auVar62);
                          *(int *)(local_2640 + 1) = auVar44._0_4_;
                          auVar48 = valignd_avx512vl(auVar45,auVar45,1);
                          local_2640 = local_2640 + 2;
                          auVar63 = ZEXT3264(auVar48);
                          lVar26 = lVar26 + -1;
                        } while (lVar26 != 0);
                        auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                        uVar32 = auVar42._0_8_;
                        auVar69 = ZEXT864(0);
                        auVar63 = ZEXT3264(auVar62);
                        iVar20 = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar20 = 6;
            }
          } while (iVar20 == 0);
        } while (iVar20 != 6);
        local_2398 = auVar63._0_32_;
        uVar25 = (ulong)((uint)uVar32 & 0xf);
        if (uVar25 != 8) {
          lVar26 = 0;
          do {
            pauVar31 = (undefined1 (*) [16])(lVar26 * 0xb0 + (uVar32 & 0xfffffffffffffff0));
            auVar38 = auVar65._0_16_;
            auVar37 = vsubps_avx(pauVar31[local_2638],auVar38);
            auVar39 = auVar66._0_16_;
            auVar35 = vsubps_avx(pauVar31[local_2628],auVar39);
            auVar67 = auVar68._0_16_;
            auVar33 = vsubps_avx(pauVar31[local_2630],auVar67);
            auVar34 = vsubps_avx(pauVar31[local_2638 + 3],auVar38);
            auVar36 = vsubps_avx(pauVar31[local_2628 + 3],auVar39);
            auVar9 = vsubps_avx(pauVar31[local_2630 + 3],auVar67);
            auVar38 = vsubps_avx(pauVar31[local_2638 + 6],auVar38);
            auVar39 = vsubps_avx(pauVar31[local_2628 + 6],auVar39);
            auVar67 = vsubps_avx(pauVar31[local_2630 + 6],auVar67);
            auVar50 = auVar78._0_16_;
            auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar33,auVar50);
            auVar54 = auVar79._0_16_;
            auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar33,auVar54);
            auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar9,auVar50);
            auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar9,auVar54);
            auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar67,auVar50);
            auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar67,auVar54);
            auVar50._0_4_ = auVar36._0_4_ * auVar38._0_4_;
            auVar50._4_4_ = auVar36._4_4_ * auVar38._4_4_;
            auVar50._8_4_ = auVar36._8_4_ * auVar38._8_4_;
            auVar50._12_4_ = auVar36._12_4_ * auVar38._12_4_;
            auVar54._0_4_ = auVar34._0_4_ * auVar39._0_4_;
            auVar54._4_4_ = auVar34._4_4_ * auVar39._4_4_;
            auVar54._8_4_ = auVar34._8_4_ * auVar39._8_4_;
            auVar54._12_4_ = auVar34._12_4_ * auVar39._12_4_;
            auVar55._0_4_ = auVar37._0_4_ * auVar39._0_4_;
            auVar55._4_4_ = auVar37._4_4_ * auVar39._4_4_;
            auVar55._8_4_ = auVar37._8_4_ * auVar39._8_4_;
            auVar55._12_4_ = auVar37._12_4_ * auVar39._12_4_;
            auVar39._0_4_ = auVar35._0_4_ * auVar38._0_4_;
            auVar39._4_4_ = auVar35._4_4_ * auVar38._4_4_;
            auVar39._8_4_ = auVar35._8_4_ * auVar38._8_4_;
            auVar39._12_4_ = auVar35._12_4_ * auVar38._12_4_;
            auVar38._0_4_ = auVar35._0_4_ * auVar34._0_4_;
            auVar38._4_4_ = auVar35._4_4_ * auVar34._4_4_;
            auVar38._8_4_ = auVar35._8_4_ * auVar34._8_4_;
            auVar38._12_4_ = auVar35._12_4_ * auVar34._12_4_;
            auVar61._0_4_ = auVar37._0_4_ * auVar36._0_4_;
            auVar61._4_4_ = auVar37._4_4_ * auVar36._4_4_;
            auVar61._8_4_ = auVar37._8_4_ * auVar36._8_4_;
            auVar61._12_4_ = auVar37._12_4_ * auVar36._12_4_;
            uVar16 = vcmpps_avx512vl(auVar50,auVar54,5);
            uVar11 = vcmpps_avx512vl(auVar38,auVar61,5);
            uVar12 = vcmpps_avx512vl(auVar55,auVar39,5);
            uVar13 = vcmpps_avx512vl(auVar50,auVar54,2);
            uVar14 = vcmpps_avx512vl(auVar38,auVar61,2);
            uVar15 = vcmpps_avx512vl(auVar55,auVar39,2);
            local_2558 = ((byte)uVar16 & (byte)uVar11 & (byte)uVar12 |
                         (byte)uVar13 & (byte)uVar14 & (byte)uVar15) & 0xf;
            if (local_2558 != 0) {
              local_2598 = vsubps_avx(auVar50,auVar54);
              local_2588 = vsubps_avx(auVar55,auVar39);
              auVar37 = vsubps_avx(auVar38,auVar61);
              auVar56._0_4_ = auVar37._0_4_ + local_2598._0_4_ + local_2588._0_4_;
              auVar56._4_4_ = auVar37._4_4_ + local_2598._4_4_ + local_2588._4_4_;
              auVar56._8_4_ = auVar37._8_4_ + local_2598._8_4_ + local_2588._8_4_;
              auVar56._12_4_ = auVar37._12_4_ + local_2598._12_4_ + local_2588._12_4_;
              uVar16 = vcmpps_avx512vl(auVar56,auVar69._0_16_,4);
              auVar35 = vrcp14ps_avx512vl(auVar56);
              auVar17._8_4_ = 0x3f800000;
              auVar17._0_8_ = &DAT_3f8000003f800000;
              auVar17._12_4_ = 0x3f800000;
              auVar34 = vfnmadd213ps_avx512vl(auVar56,auVar35,auVar17);
              local_2568 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
              auVar34 = auVar80._0_16_;
              auVar35 = vmulps_avx512vl(auVar34,auVar33);
              auVar33 = vmulps_avx512vl(auVar34,auVar9);
              auVar34 = vmulps_avx512vl(auVar34,auVar67);
              auVar58._0_4_ = auVar37._0_4_ * auVar34._0_4_;
              auVar58._4_4_ = auVar37._4_4_ * auVar34._4_4_;
              auVar58._8_4_ = auVar37._8_4_ * auVar34._8_4_;
              auVar58._12_4_ = auVar37._12_4_ * auVar34._12_4_;
              auVar37 = vfmadd231ps_fma(auVar58,local_2588,auVar33);
              auVar37 = vfmadd231ps_fma(auVar37,local_2598,auVar35);
              fVar49 = local_2568._0_4_;
              local_2578._0_4_ = auVar37._0_4_ * fVar49;
              fVar6 = local_2568._4_4_;
              local_2578._4_4_ = auVar37._4_4_ * fVar6;
              fVar7 = local_2568._8_4_;
              local_2578._8_4_ = auVar37._8_4_ * fVar7;
              fVar8 = local_2568._12_4_;
              local_2578._12_4_ = auVar37._12_4_ * fVar8;
              auVar53 = ZEXT1664(local_2578);
              uVar60 = *(undefined4 *)((long)&(local_2658->super_RayK<1>).org.field_0 + 0xc);
              auVar9._4_4_ = uVar60;
              auVar9._0_4_ = uVar60;
              auVar9._8_4_ = uVar60;
              auVar9._12_4_ = uVar60;
              uVar11 = vcmpps_avx512vl(local_2578,auVar9,0xe);
              fVar2 = (local_2658->super_RayK<1>).tfar;
              auVar67._4_4_ = fVar2;
              auVar67._0_4_ = fVar2;
              auVar67._8_4_ = fVar2;
              auVar67._12_4_ = fVar2;
              uVar12 = vcmpps_avx512vl(local_2578,auVar67,2);
              local_2558 = (byte)uVar16 & (byte)uVar11 & (byte)uVar12 & local_2558;
              if (local_2558 != 0) {
                auVar37 = vsubps_avx(pauVar31[6],*pauVar31);
                auVar35 = vsubps_avx(pauVar31[7],pauVar31[1]);
                auVar33 = vsubps_avx(pauVar31[8],pauVar31[2]);
                auVar34 = vsubps_avx(*pauVar31,pauVar31[3]);
                auVar36 = vsubps_avx(pauVar31[1],pauVar31[4]);
                auVar9 = vsubps_avx(pauVar31[2],pauVar31[5]);
                auVar64._0_4_ = auVar33._0_4_ * auVar36._0_4_;
                auVar64._4_4_ = auVar33._4_4_ * auVar36._4_4_;
                auVar64._8_4_ = auVar33._8_4_ * auVar36._8_4_;
                auVar64._12_4_ = auVar33._12_4_ * auVar36._12_4_;
                local_2518 = vfmsub231ps_fma(auVar64,auVar35,auVar9);
                auVar59._0_4_ = auVar9._0_4_ * auVar37._0_4_;
                auVar59._4_4_ = auVar9._4_4_ * auVar37._4_4_;
                auVar59._8_4_ = auVar9._8_4_ * auVar37._8_4_;
                auVar59._12_4_ = auVar9._12_4_ * auVar37._12_4_;
                local_2508 = vfmsub231ps_fma(auVar59,auVar34,auVar33);
                auVar57._0_4_ = auVar34._0_4_ * auVar35._0_4_;
                auVar57._4_4_ = auVar34._4_4_ * auVar35._4_4_;
                auVar57._8_4_ = auVar34._8_4_ * auVar35._8_4_;
                auVar57._12_4_ = auVar34._12_4_ * auVar35._12_4_;
                local_24f8 = vfmsub231ps_fma(auVar57,auVar37,auVar36);
                local_2528 = local_2578;
                local_2548[0] = local_2598._0_4_ * fVar49;
                local_2548[1] = local_2598._4_4_ * fVar6;
                local_2548[2] = local_2598._8_4_ * fVar7;
                local_2548[3] = local_2598._12_4_ * fVar8;
                local_2538[0] = fVar49 * local_2588._0_4_;
                local_2538[1] = fVar6 * local_2588._4_4_;
                local_2538[2] = fVar7 * local_2588._8_4_;
                local_2538[3] = fVar8 * local_2588._12_4_;
                local_2618 = local_2620->scene;
                auVar51._8_4_ = 0x7f800000;
                auVar51._0_8_ = 0x7f8000007f800000;
                auVar51._12_4_ = 0x7f800000;
                auVar37 = vblendmps_avx512vl(auVar51,local_2578);
                auVar40._0_4_ =
                     (uint)(local_2558 & 1) * auVar37._0_4_ |
                     (uint)!(bool)(local_2558 & 1) * 0x7f800000;
                bVar5 = (bool)(local_2558 >> 1 & 1);
                auVar40._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_2558 >> 2 & 1);
                auVar40._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * 0x7f800000;
                auVar40._12_4_ =
                     (uint)(local_2558 >> 3) * auVar37._12_4_ |
                     (uint)!(bool)(local_2558 >> 3) * 0x7f800000;
                auVar37 = vshufps_avx(auVar40,auVar40,0xb1);
                auVar37 = vminps_avx(auVar37,auVar40);
                auVar35 = vshufpd_avx(auVar37,auVar37,1);
                auVar37 = vminps_avx(auVar35,auVar37);
                uVar16 = vcmpps_avx512vl(auVar40,auVar37,0);
                local_2684 = (uint)local_2558;
                uVar28 = (uint)((byte)uVar16 & local_2558);
                if (((byte)uVar16 & local_2558) == 0) {
                  uVar28 = local_2684;
                }
                uVar23 = 0;
                for (uVar22 = (ulong)uVar28; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  uVar23 = uVar23 + 1;
                }
                do {
                  local_25b0 = *(uint *)(pauVar31[9] + uVar23 * 4);
                  local_2650 = (ulong)local_25b0;
                  local_2648 = (local_2618->geometries).items[local_25b0].ptr;
                  if ((local_2648->mask & (local_2658->super_RayK<1>).mask) == 0) {
                    local_2684 = (uint)(~(byte)(1 << ((uint)uVar23 & 0x1f)) & (byte)local_2684);
                    bVar5 = true;
                  }
                  else if ((local_2620->args->filter == (RTCFilterFunctionN)0x0) &&
                          (local_2648->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar5 = false;
                  }
                  else {
                    local_2660 = local_2620->args;
                    local_24e8 = auVar53._0_16_;
                    local_24d8 = auVar80._0_16_;
                    local_24c8 = auVar79._0_16_;
                    local_24b8 = auVar78._0_16_;
                    local_2478 = auVar77._0_32_;
                    local_2458 = auVar76._0_32_;
                    local_2438 = auVar75._0_32_;
                    local_2418 = auVar74._0_32_;
                    local_23f8 = auVar72._0_32_;
                    local_23d8 = auVar71._0_32_;
                    local_23b8 = auVar70._0_32_;
                    local_24a8 = auVar68._0_16_;
                    local_2498 = auVar66._0_16_;
                    local_2488 = auVar65._0_16_;
                    local_25f8.context = local_2620->user;
                    local_25c8 = *(float *)(local_2518 + uVar23 * 4);
                    local_25c4 = *(undefined4 *)(local_2508 + uVar23 * 4);
                    local_25c0 = *(undefined4 *)(local_24f8 + uVar23 * 4);
                    local_25bc = local_2548[uVar23];
                    local_25b8 = local_2538[uVar23];
                    local_25b4 = *(undefined4 *)(pauVar31[10] + uVar23 * 4);
                    local_25ac = (local_25f8.context)->instID[0];
                    local_25a8 = (local_25f8.context)->instPrimID[0];
                    fVar2 = (local_2658->super_RayK<1>).tfar;
                    (local_2658->super_RayK<1>).tfar = *(float *)(local_2528 + uVar23 * 4);
                    local_2664 = -1;
                    local_25f8.valid = &local_2664;
                    local_25f8.geometryUserPtr = local_2648->userPtr;
                    local_25f8.ray = (RTCRayN *)local_2658;
                    local_25f8.hit = (RTCHitN *)&local_25c8;
                    local_25f8.N = 1;
                    if ((local_2648->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_2648->intersectionFilterN)(&local_25f8), *local_25f8.valid != 0)) {
                      if (local_2660->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_2660->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_2648->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_2660->filter)(&local_25f8);
                        }
                        if (*local_25f8.valid == 0) goto LAB_01fbf730;
                      }
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25f8.hit;
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25f8.hit + 4);
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25f8.hit + 8);
                      *(float *)((long)local_25f8.ray + 0x3c) = *(float *)(local_25f8.hit + 0xc);
                      *(float *)((long)local_25f8.ray + 0x40) = *(float *)(local_25f8.hit + 0x10);
                      *(float *)((long)local_25f8.ray + 0x44) = *(float *)(local_25f8.hit + 0x14);
                      *(float *)((long)local_25f8.ray + 0x48) = *(float *)(local_25f8.hit + 0x18);
                      *(float *)((long)local_25f8.ray + 0x4c) = *(float *)(local_25f8.hit + 0x1c);
                      *(float *)((long)local_25f8.ray + 0x50) = *(float *)(local_25f8.hit + 0x20);
                    }
                    else {
LAB_01fbf730:
                      (local_2658->super_RayK<1>).tfar = fVar2;
                    }
                    auVar53 = ZEXT1664(local_24e8);
                    fVar2 = (local_2658->super_RayK<1>).tfar;
                    auVar18._4_4_ = fVar2;
                    auVar18._0_4_ = fVar2;
                    auVar18._8_4_ = fVar2;
                    auVar18._12_4_ = fVar2;
                    uVar16 = vcmpps_avx512vl(local_24e8,auVar18,2);
                    local_2684 = (uint)(byte)(~(byte)(1 << ((uint)uVar23 & 0x1f)) & (byte)local_2684
                                             & (byte)uVar16);
                    bVar5 = true;
                    auVar65 = ZEXT1664(local_2488);
                    auVar66 = ZEXT1664(local_2498);
                    auVar68 = ZEXT1664(local_24a8);
                    auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar70 = ZEXT3264(local_23b8);
                    auVar71 = ZEXT3264(local_23d8);
                    auVar72 = ZEXT3264(local_23f8);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar73 = ZEXT3264(auVar42);
                    auVar74 = ZEXT3264(local_2418);
                    auVar75 = ZEXT3264(local_2438);
                    auVar76 = ZEXT3264(local_2458);
                    auVar77 = ZEXT3264(local_2478);
                    auVar78 = ZEXT1664(local_24b8);
                    auVar79 = ZEXT1664(local_24c8);
                    auVar80 = ZEXT1664(local_24d8);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar81 = ZEXT3264(auVar42);
                    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar82 = ZEXT3264(auVar42);
                    auVar37 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar83 = ZEXT1664(auVar37);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar84 = ZEXT3264(auVar42);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar85 = ZEXT3264(auVar42);
                  }
                  if (!bVar5) {
                    fVar2 = local_2548[uVar23];
                    fVar49 = local_2538[uVar23];
                    (local_2658->super_RayK<1>).tfar = *(float *)(local_2528 + uVar23 * 4);
                    (local_2658->Ng).field_0.field_0.x = *(float *)(local_2518 + uVar23 * 4);
                    (local_2658->Ng).field_0.field_0.y = *(float *)(local_2508 + uVar23 * 4);
                    (local_2658->Ng).field_0.field_0.z = *(float *)(local_24f8 + uVar23 * 4);
                    local_2658->u = fVar2;
                    local_2658->v = fVar49;
                    local_2658->primID = *(uint *)(pauVar31[10] + uVar23 * 4);
                    local_2658->geomID = (uint)local_2650;
                    pRVar4 = local_2620->user;
                    local_2658->instID[0] = pRVar4->instID[0];
                    local_2658->instPrimID[0] = pRVar4->instPrimID[0];
                    break;
                  }
                  bVar19 = (byte)local_2684;
                  if (bVar19 == 0) break;
                  auVar52._8_4_ = 0x7f800000;
                  auVar52._0_8_ = 0x7f8000007f800000;
                  auVar52._12_4_ = 0x7f800000;
                  auVar37 = vblendmps_avx512vl(auVar52,auVar53._0_16_);
                  auVar41._0_4_ =
                       (uint)(bVar19 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
                  bVar5 = (bool)((byte)(local_2684 >> 1) & 1);
                  auVar41._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * 0x7f800000;
                  bVar5 = (bool)((byte)(local_2684 >> 2) & 1);
                  auVar41._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * 0x7f800000;
                  auVar41._12_4_ =
                       (local_2684 >> 3) * auVar37._12_4_ |
                       (uint)!SUB41(local_2684 >> 3,0) * 0x7f800000;
                  auVar37 = vshufps_avx(auVar41,auVar41,0xb1);
                  auVar37 = vminps_avx(auVar37,auVar41);
                  auVar35 = vshufpd_avx(auVar37,auVar37,1);
                  auVar37 = vminps_avx(auVar35,auVar37);
                  uVar16 = vcmpps_avx512vl(auVar41,auVar37,0);
                  bVar19 = (byte)uVar16 & bVar19;
                  uVar28 = local_2684;
                  if (bVar19 != 0) {
                    uVar28 = (uint)bVar19;
                  }
                  uVar21 = 0;
                  for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                    uVar21 = uVar21 + 1;
                  }
                  uVar23 = (ulong)uVar21;
                } while( true );
              }
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != uVar25 - 8);
        }
        fVar2 = (local_2658->super_RayK<1>).tfar;
        auVar53 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412
                                                  (fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))))
        ;
        auVar63 = ZEXT3264(local_2398);
        uVar25 = local_2608;
        uVar23 = local_2610;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }